

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

int pdrv(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  stringstream msg_2;
  exception *ex_2;
  bool isDisplayValid;
  stringstream msg_1;
  exception *ex_1;
  undefined1 local_790 [4];
  int status;
  StatisticsApp application;
  stringstream msg;
  exception *ex;
  undefined1 local_260 [8];
  CommandLineParser parser;
  CommandLineOptions options;
  char **argv_local;
  int argc_local;
  
  CommandLineOptions::CommandLineOptions((CommandLineOptions *)&parser._showUsage);
  CommandLineParser::CommandLineParser((CommandLineParser *)local_260,argc,argv);
  bVar1 = CommandLineParser::showUsage((CommandLineParser *)local_260);
  if (bVar1) {
    CommandLineParser::printUsage();
    argv_local._4_4_ = 0;
    bVar1 = true;
  }
  else {
    bVar1 = CommandLineParser::showVersion((CommandLineParser *)local_260);
    if (bVar1) {
      CommandLineParser::printVersion();
      argv_local._4_4_ = 0;
      bVar1 = true;
    }
    else {
      CommandLineOptions::operator=
                ((CommandLineOptions *)&parser._showUsage,(CommandLineOptions *)local_260);
      bVar1 = false;
    }
  }
  CommandLineParser::~CommandLineParser((CommandLineParser *)local_260);
  if (!bVar1) {
    StatisticsApp::StatisticsApp
              ((StatisticsApp *)local_790,(CommandLineOptions *)&parser._showUsage);
    iVar2 = StatisticsApp::run((StatisticsApp *)local_790);
    if (iVar2 == 0) {
      bVar1 = StatisticsApp::display((StatisticsApp *)local_790);
      if (bVar1) {
        argv_local._4_4_ = 0;
      }
      else {
        argv_local._4_4_ = 3;
      }
    }
    else {
      argv_local._4_4_ = 2;
    }
    StatisticsApp::~StatisticsApp((StatisticsApp *)local_790);
  }
  CommandLineOptions::~CommandLineOptions((CommandLineOptions *)&parser._showUsage);
  return argv_local._4_4_;
}

Assistant:

int
pdrv(int argc,
     char * argv[])
{

    // ======================================================================
    // Parse command line arguments
    // ----------------------------------------------------------------------
    CommandLineOptions options;

    try
    {
        CommandLineParser parser(argc, argv);
        if (parser.showUsage())
        {
            CommandLineParser::printUsage();
            return AppStatus::SUCCESS;
        }
        else if (parser.showVersion())
        {
            CommandLineParser::printVersion();
            return AppStatus::SUCCESS;
        }
        options = parser.options;
    }
    catch (std::exception & ex)
    {
        LOG_MESSAGE(Logger::Level::FATAL, ex.what());
        return AppStatus::FAILED_PARSING;
    }

    // ======================================================================
    // Launch application
    // ----------------------------------------------------------------------
    StatisticsApp application(options);

    try
    {
        int status = application.run();
        if (status != 0) return AppStatus::FAILED_RUN;
    }
    catch (std::exception & ex)
    {
        LOG_MESSAGE(Logger::Level::FATAL, ex.what());
        return AppStatus::FAILED_RUN;
    }

    // ======================================================================
    // Display results
    // ----------------------------------------------------------------------
    
    try
    {
        bool isDisplayValid = application.display();
        if (!isDisplayValid) return AppStatus::FAILED_DISPLAY;
    }
    catch (std::exception & ex)
    {
        LOG_MESSAGE(Logger::Level::FATAL, ex.what());
        return AppStatus::FAILED_DISPLAY;
    }
        
    return AppStatus::SUCCESS;

}